

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O3

int Insert_String(FORM *form,int row,char *txt,int len)

{
  FIELD *field;
  _Bool _Var1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  undefined2 *__ptr;
  char *buf;
  WINDOW_conflict **ppWVar5;
  int iVar6;
  int local_54;
  
  field = form->current;
  buf = field->buf + field->dcols * row;
  pcVar4 = After_End_Of_Data(buf,field->dcols);
  local_54 = field->dcols;
  iVar6 = ((int)buf - (int)pcVar4) + local_54;
  __ptr = (undefined2 *)malloc(2);
  *__ptr = 0x20;
  if (iVar6 <= len) {
    iVar2 = field->drows + -1;
    if (iVar2 == row) {
      iVar3 = -0xc;
      if ((field->status & 8) == 0) goto LAB_003a164c;
      _Var1 = Field_Grown(field,1);
      iVar3 = -1;
      if (!_Var1) goto LAB_003a164c;
      local_54 = field->dcols;
      buf = field->buf + local_54 * row;
      iVar2 = field->drows + -1;
    }
    iVar3 = -0xc;
    if (iVar2 <= row) goto LAB_003a164c;
    pcVar4 = Get_Start_Of_Data(buf + (long)~len + (long)local_54,len + 1);
    pcVar4 = After_Last_Whitespace_Character(buf,(int)pcVar4 - (int)buf);
    iVar2 = (int)pcVar4 - (int)buf;
    iVar3 = Insert_String(form,row + 1,pcVar4,field->dcols - (iVar6 + iVar2));
    if (iVar3 != 0) goto LAB_003a164c;
    wmove(form->w,row,iVar2);
    wclrtoeol(form->w);
  }
  ppWVar5 = &form->w;
  iVar3 = 0;
  wmove(*ppWVar5,row,0);
  winsnstr(*ppWVar5,txt,len);
  wmove(*ppWVar5,row,len);
  winsnstr(*ppWVar5,__ptr,1);
LAB_003a164c:
  free(__ptr);
  return iVar3;
}

Assistant:

static int Insert_String(FORM *form, int row, char *txt, int len)
{ 
  FIELD  *field    = form->current;
  char *bp         = Address_Of_Row_In_Buffer(field,row);
  int datalen      = (int)(After_End_Of_Data(bp,field->dcols) - bp);
  int freelen      = field->dcols - datalen;
  int requiredlen  = len+1;
  char *split;
  int result = E_REQUEST_DENIED;
  char *Space;

  Space = (char*)malloc(2*sizeof(char));
  strcpy(Space, " ");

  if (freelen >= requiredlen)
    {
      wmove(form->w,row,0);
      winsnstr(form->w,txt,len);
      wmove(form->w,row,len);
      winsnstr(form->w,Space,1);
      free(Space);
      return E_OK;
    }
  else
    { /* we have to move characters on the next line. If we are on the
         last line this may work, if the field is growable */
      if ((row == (field->drows - 1)) && Growable(field))
        {
          if (!Field_Grown(field,1))
            {
            free(Space);
            return(E_SYSTEM_ERROR);
            }
          /* !!!Side-Effect : might be changed due to growth!!! */
          bp = Address_Of_Row_In_Buffer(field,row); 
        }

      if (row < (field->drows - 1)) 
        { 
          split = After_Last_Whitespace_Character(bp,
                    (int)(Get_Start_Of_Data(bp + field->dcols - requiredlen ,
                                            requiredlen) - bp));
          /* split points now to the first character of the portion of the
             line that must be moved to the next line */
          datalen = (int)(split-bp); /* + freelen has to stay on this line   */
          freelen = field->dcols - (datalen + freelen); /* for the next line */

          if ((result=Insert_String(form,row+1,split,freelen))==E_OK) 
            {
              wmove(form->w,row,datalen);
              wclrtoeol(form->w);
              wmove(form->w,row,0);
              winsnstr(form->w,txt,len);
              wmove(form->w,row,len);
              winsnstr(form->w,Space,1);
              free(Space);
              return E_OK;
            }
        }
      free(Space);
      return(result);
    }
}